

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O3

matches * atombf_a(iasctx *ctx,void *v,int spos)

{
  litem *plVar1;
  easm_expr *peVar2;
  ull num;
  uint64_t uVar3;
  int iVar4;
  matches *pmVar5;
  match *__dest;
  match res;
  match local_e0;
  
  if ((ctx->atomsnum != spos) && (plVar1 = ctx->atoms[spos], plVar1->type == LITEM_EXPR)) {
    memset(&local_e0,0,0xb8);
    local_e0.lpos = spos + 1;
    peVar2 = plVar1->expr;
    if (peVar2->type != EASM_EXPR_VEC) {
      return (matches *)0x0;
    }
    if ((peVar2->e1->type == EASM_EXPR_NUM) && (peVar2->e2->type == EASM_EXPR_NUM)) {
      num = peVar2->e1->num;
      uVar3 = peVar2->e2->num;
      iVar4 = setbf(&local_e0,(bitfield *)v,num);
      if ((iVar4 != 0) &&
         (iVar4 = setbf(&local_e0,(bitfield *)((long)v + 0x30),uVar3 - num), iVar4 != 0)) {
        pmVar5 = (matches *)calloc(0x10,1);
        pmVar5->mmax = 0x10;
        __dest = (match *)malloc(0xb80);
        pmVar5->m = __dest;
        pmVar5->mnum = 1;
        memcpy(__dest,&local_e0,0xb8);
        return pmVar5;
      }
    }
  }
  return (matches *)0x0;
}

Assistant:

struct matches *atombf_a APROTO {
	const struct bitfield *bf = v;
	if (spos == ctx->atomsnum || ctx->atoms[spos]->type != LITEM_EXPR)
		return 0;
	struct match res = { 0, .lpos = spos+1 };
	const struct easm_expr *expr = ctx->atoms[spos]->expr;
	if (expr->type != EASM_EXPR_VEC || expr->e1->type != EASM_EXPR_NUM || expr->e2->type != EASM_EXPR_NUM)
		return 0;
	uint64_t a = expr->e1->num;
	uint64_t b = expr->e2->num - a;
	if (!setbf(&res, &bf[0], a))
		return 0;
	if (!setbf(&res, &bf[1], b))
		return 0;
	struct matches *rres = emptymatches();
	ADDARRAY(rres->m, res);
	return rres;
}